

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O2

void * kj::_::HeapArrayDisposer::allocateImpl
                 (size_t elementSize,size_t elementCount,size_t capacity,
                 _func_void_void_ptr *constructElement,_func_void_void_ptr *destroyElement)

{
  byte *pbVar1;
  byte *pos;
  byte *pbVar2;
  bool bVar3;
  ExceptionSafeArrayUtil guard;
  ExceptionSafeArrayUtil local_48;
  
  pbVar1 = (byte *)operator_new(capacity * elementSize);
  if (constructElement != (_func_void_void_ptr *)0x0) {
    pbVar2 = pbVar1;
    if (destroyElement == (_func_void_void_ptr *)0x0) {
      while (bVar3 = elementCount != 0, elementCount = elementCount - 1, bVar3) {
        (*constructElement)(pbVar2);
        pbVar2 = pbVar2 + elementSize;
      }
    }
    else {
      local_48.constructedElementCount = 0;
      local_48.pos = pbVar1;
      local_48.elementSize = elementSize;
      local_48.destroyElement = destroyElement;
      ExceptionSafeArrayUtil::construct(&local_48,elementCount,constructElement);
      local_48.constructedElementCount = 0;
      ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil(&local_48);
    }
  }
  operator_delete((void *)0x0);
  return pbVar1;
}

Assistant:

void* HeapArrayDisposer::allocateImpl(size_t elementSize, size_t elementCount, size_t capacity,
                                      void (*constructElement)(void*),
                                      void (*destroyElement)(void*)) {
  AutoDeleter result(operator new(elementSize * capacity));

  if (constructElement == nullptr) {
    // Nothing to do.
  } else if (destroyElement == nullptr) {
    byte* pos = reinterpret_cast<byte*>(result.ptr);
    while (elementCount > 0) {
      constructElement(pos);
      pos += elementSize;
      --elementCount;
    }
  } else {
    ExceptionSafeArrayUtil guard(result.ptr, elementSize, 0, destroyElement);
    guard.construct(elementCount, constructElement);
    guard.release();
  }

  return result.release();
}